

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O0

void __thiscall pg::MSPMSolver::run(MSPMSolver *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  void *this_00;
  reference pvVar17;
  ostream *poVar18;
  Error *pEVar19;
  char *pcVar20;
  int local_224;
  int local_1f0;
  bool local_159;
  int winner;
  int *pm;
  int local_f8;
  int i_5;
  int n_5;
  int to_1;
  int *curedge_4;
  bool escapes_1;
  int *piStack_e0;
  int from_2;
  int *curedge_3;
  int local_d0;
  int iStack_cc;
  bool pl_1;
  int n_4;
  int to;
  int *curedge_2;
  int local_b8;
  bool escapes;
  int pl;
  value_type local_a4;
  undefined1 local_a0 [4];
  int n_3;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int m;
  int from_1;
  int *curedge_1;
  int n_2;
  int from;
  int *curedge;
  int iStack_28;
  bool lifted;
  int n_1;
  int n;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  MSPMSolver *this_local;
  
  lVar13 = Solver::nodecount(&this->super_Solver);
  iVar10 = Solver::priority(&this->super_Solver,(int)lVar13 + -1);
  this->k = iVar10 + 1;
  iVar10 = this->k;
  lVar13 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = iVar10 * lVar13;
  uVar14 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->pms = piVar15;
  uVar14 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar14;
  uVar14 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->strategy = piVar15;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->k;
  uVar14 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->counts = piVar15;
  uVar14 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar14;
  uVar14 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->cover = piVar15;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)this->k;
  uVar14 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->tmp = piVar15;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)this->k;
  uVar14 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->best = piVar15;
  for (i_2 = 0; iVar10 = this->k, lVar13 = Solver::nodecount(&this->super_Solver),
      (long)i_2 < iVar10 * lVar13; i_2 = i_2 + 1) {
    this->pms[i_2] = 0;
  }
  for (i_3 = 0; lVar13 = Solver::nodecount(&this->super_Solver), i_3 < lVar13; i_3 = i_3 + 1) {
    this->strategy[i_3] = -1;
  }
  for (i_4 = 0; lVar13 = Solver::nodecount(&this->super_Solver), i_4 < lVar13; i_4 = i_4 + 1) {
    bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)i_4);
    iVar10 = 0;
    if (bVar8) {
      iVar10 = -2;
    }
    this->cover[i_4] = iVar10;
  }
  for (n = 0; n < this->k; n = n + 1) {
    this->counts[n] = 0;
  }
  for (n_1 = 0; lVar13 = Solver::nodecount(&this->super_Solver), n_1 < lVar13; n_1 = n_1 + 1) {
    if (this->cover[n_1] == 0) {
      piVar15 = this->counts;
      iVar10 = Solver::priority(&this->super_Solver,n_1);
      piVar15[iVar10] = piVar15[iVar10] + 1;
    }
  }
  this->lift_attempt = 0;
  this->lift_count = 0;
  uVar14 = Solver::nodecount(&this->super_Solver);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar14;
  uVar14 = SUB168(auVar7 * ZEXT816(4),0);
  if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  piVar15 = (int *)operator_new__(uVar14);
  this->dirty = piVar15;
  for (iStack_28 = 0; lVar13 = Solver::nodecount(&this->super_Solver), iStack_28 < lVar13;
      iStack_28 = iStack_28 + 1) {
    this->dirty[iStack_28] = 0;
  }
  this->coverdepth = 0;
  lVar13 = Solver::nodecount(&this->super_Solver);
  curedge._4_4_ = (int)lVar13;
  while (curedge._4_4_ = curedge._4_4_ + -1, -1 < curedge._4_4_) {
    local_159 = false;
    if (this->cover[curedge._4_4_] == 0) {
      local_159 = lift(this,curedge._4_4_,-1);
    }
    if ((this->cover[curedge._4_4_] == -1) || (local_159 != false)) {
      for (_n_2 = Solver::ins(&this->super_Solver,curedge._4_4_); *_n_2 != -1; _n_2 = _n_2 + 1) {
        iVar10 = *_n_2;
        if ((this->cover[iVar10] == 0) && (bVar8 = lift(this,iVar10,curedge._4_4_), bVar8)) {
          todo_push(this,iVar10);
        }
      }
    }
  }
  do {
    bVar8 = std::deque<int,_std::allocator<int>_>::empty(&this->todo);
    if (((bVar8 ^ 0xffU) & 1) == 0) {
      if ((this->super_Solver).trace != 0) {
        for (local_f8 = 0; lVar13 = Solver::nodecount(&this->super_Solver), local_f8 < lVar13;
            local_f8 = local_f8 + 1) {
          poVar18 = std::operator<<((this->super_Solver).logger,"\x1b[1;31mnode ");
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,local_f8);
          poVar18 = std::operator<<(poVar18,"/");
          iVar10 = Solver::priority(&this->super_Solver,local_f8);
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar10);
          iVar10 = Solver::owner(&this->super_Solver,local_f8);
          pcVar20 = " (even)";
          if (iVar10 != 0) {
            pcVar20 = " (odd)";
          }
          poVar18 = std::operator<<(poVar18,pcVar20);
          std::operator<<(poVar18,"\x1b[m is");
          pm_stream(this,(this->super_Solver).logger,this->pms + this->k * local_f8);
          if (-1 < this->cover[local_f8]) {
            poVar18 = std::operator<<((this->super_Solver).logger," cover: ");
            std::ostream::operator<<(poVar18,this->cover[local_f8]);
          }
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
      }
      pm._4_4_ = 0;
      do {
        lVar13 = Solver::nodecount(&this->super_Solver);
        if (lVar13 <= pm._4_4_) {
          if (this->pms != (int *)0x0) {
            operator_delete__(this->pms);
          }
          if (this->strategy != (int *)0x0) {
            operator_delete__(this->strategy);
          }
          if (this->counts != (int *)0x0) {
            operator_delete__(this->counts);
          }
          if (this->cover != (int *)0x0) {
            operator_delete__(this->cover);
          }
          if (this->dirty != (int *)0x0) {
            operator_delete__(this->dirty);
          }
          if (this->tmp != (int *)0x0) {
            operator_delete__(this->tmp);
          }
          if (this->best != (int *)0x0) {
            operator_delete__(this->best);
          }
          poVar18 = std::operator<<((this->super_Solver).logger,"solved with ");
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->lift_count);
          poVar18 = std::operator<<(poVar18," lifts, ");
          poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->lift_attempt);
          poVar18 = std::operator<<(poVar18," lift attempts.");
          std::ostream::operator<<(poVar18,std::endl<char,std::char_traits<char>>);
          return;
        }
        bVar8 = bitset::operator[]((this->super_Solver).disabled,(long)pm._4_4_);
        if (!bVar8) {
          piVar15 = this->pms + this->k * pm._4_4_;
          if ((*piVar15 == -1) == (piVar15[1] == -1)) {
            pEVar19 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(pEVar19,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                         ,0x204);
            __cxa_throw(pEVar19,&Error::typeinfo,Error::~Error);
          }
          iVar10 = *piVar15;
          uVar12 = Solver::owner(&this->super_Solver,pm._4_4_);
          if (uVar12 == (iVar10 != -1)) {
            local_224 = this->strategy[pm._4_4_];
          }
          else {
            local_224 = -1;
          }
          Solver::solve(&this->super_Solver,pm._4_4_,(uint)(iVar10 != -1),local_224);
        }
        pm._4_4_ = pm._4_4_ + 1;
      } while( true );
    }
    iVar10 = todo_pop(this);
    if ((this->cover[iVar10] == -1) || (this->cover[iVar10] == 0)) {
      for (_m = Solver::ins(&this->super_Solver,iVar10); *_m != -1; _m = _m + 1) {
        q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_node._4_4_ = *_m;
        if ((this->cover
             [q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node._4_4_] == 0) &&
           (bVar8 = lift(this,q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node._4_4_,iVar10), bVar8)) {
          todo_push(this,q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node._4_4_);
        }
      }
    }
    while( true ) {
      bVar9 = std::deque<int,_std::allocator<int>_>::empty(&this->todo);
      bVar8 = false;
      if (bVar9) {
        bVar8 = this->coverdepth != 0;
      }
      if (!bVar8) break;
      q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_node._0_4_ = this->coverdepth;
      this->coverdepth =
           (int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node + -1;
      std::queue<int,std::deque<int,std::allocator<int>>>::
      queue<std::deque<int,std::allocator<int>>,void>
                ((queue<int,std::deque<int,std::allocator<int>>> *)local_a0);
      for (local_a4 = 0; lVar13 = (long)local_a4, lVar16 = Solver::nodecount(&this->super_Solver),
          lVar13 < lVar16; local_a4 = local_a4 + 1) {
        if (this->cover[local_a4] ==
            (int)q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_node) {
          this->cover[local_a4] = 0;
          if ((this->super_Solver).trace != 0) {
            poVar18 = std::operator<<((this->super_Solver).logger,"\x1b[7;31;1muncovering\x1b[m ");
            this_00 = (void *)std::ostream::operator<<(poVar18,local_a4);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          }
          local_b8 = Solver::owner(&this->super_Solver,local_a4);
          curedge_2._7_1_ = 0;
          for (_n_4 = Solver::outs(&this->super_Solver,local_a4); *_n_4 != -1; _n_4 = _n_4 + 1) {
            iStack_cc = *_n_4;
            if (this->cover[iStack_cc] != -2) {
              bVar8 = Game::isSolved((this->super_Solver).game,iStack_cc);
              if (bVar8) {
                iVar10 = Game::getWinner((this->super_Solver).game,iStack_cc);
                if (iVar10 == local_b8) {
                  Solver::solve(&this->super_Solver,local_a4,local_b8,iStack_cc);
                  this->cover[local_a4] = -1;
                  this->pms[this->k * local_a4 + local_b8] = -1;
                  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0,
                             &local_a4);
                  todo_push(this,local_a4);
                  break;
                }
              }
              else {
                curedge_2._7_1_ = 1;
              }
            }
          }
          if (this->cover[local_a4] != -1) {
            if ((curedge_2._7_1_ & 1) == 0) {
              Solver::solve(&this->super_Solver,local_a4,1 - local_b8,-1);
              this->cover[local_a4] = -1;
              this->pms[(this->k * local_a4 - local_b8) + 1] = -1;
              std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                        ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0,&local_a4);
              todo_push(this,local_a4);
            }
            else {
              lift(this,local_a4,-1);
              todo_push(this,local_a4);
            }
          }
        }
      }
      while (bVar8 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                               ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0),
            ((bVar8 ^ 0xffU) & 1) != 0) {
        pvVar17 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0);
        local_d0 = *pvVar17;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0);
        bVar8 = Game::isSolved((this->super_Solver).game,local_d0);
        if (!bVar8) {
          pEVar19 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(pEVar19,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                       ,0x1dc);
          __cxa_throw(pEVar19,&Error::typeinfo,Error::~Error);
        }
        iVar10 = Game::getWinner((this->super_Solver).game,local_d0);
        curedge_3._7_1_ = iVar10 != 0;
        for (piStack_e0 = Solver::ins(&this->super_Solver,local_d0); *piStack_e0 != -1;
            piStack_e0 = piStack_e0 + 1) {
          curedge_4._4_4_ = *piStack_e0;
          if (this->cover[curedge_4._4_4_] == 0) {
            uVar12 = Solver::owner(&this->super_Solver,curedge_4._4_4_);
            if (uVar12 != (curedge_3._7_1_ & 1)) {
              curedge_4._3_1_ = 0;
              for (_n_5 = Solver::outs(&this->super_Solver,curedge_4._4_4_); *_n_5 != -1;
                  _n_5 = _n_5 + 1) {
                if (-1 < this->cover[*_n_5]) {
                  if (this->cover[*_n_5] != 0) {
                    pEVar19 = (Error *)__cxa_allocate_exception(0x40);
                    Error::Error(pEVar19,"logic error",
                                 "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/mspm.cpp"
                                 ,0x1e6);
                    __cxa_throw(pEVar19,&Error::typeinfo,Error::~Error);
                  }
                  curedge_4._3_1_ = 1;
                  break;
                }
              }
              if ((curedge_4._3_1_ & 1) != 0) goto LAB_00216d4b;
            }
            iVar10 = curedge_4._4_4_;
            uVar12 = (uint)curedge_3._7_1_;
            uVar11 = Solver::owner(&this->super_Solver,curedge_4._4_4_);
            if (uVar11 == (curedge_3._7_1_ & 1)) {
              local_1f0 = local_d0;
            }
            else {
              local_1f0 = -1;
            }
            Solver::solve(&this->super_Solver,iVar10,uVar12 & 1,local_1f0);
            this->cover[curedge_4._4_4_] = -1;
            this->pms[(int)(this->k * curedge_4._4_4_ + (curedge_3._7_1_ & 1))] = -1;
            std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0,
                       (value_type *)((long)&curedge_4 + 4));
            todo_push(this,curedge_4._4_4_);
          }
LAB_00216d4b:
        }
      }
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_a0);
    }
  } while( true );
}

Assistant:

void
MSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;

    // now create the data structure, for each node
    pms = new int[k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    cover = new int[nodecount()];
    tmp = new int[k];
    best = new int[k];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize cover
    for (int i=0; i<nodecount(); i++) cover[i] = disabled[i] ? -2 : 0;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (cover[i] == 0) counts[priority(i)]++;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    // initialize all nodes as not dirty
    dirty = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // initialize cover depth to 0
    coverdepth = 0;

    /**
     * First loop, starting with standard "lift" for nodes and "liftR" for predecessors.
     * Can already find "Top" here, so add covered nodes to <deferred>.
     */
    for (int n=nodecount()-1; n>=0; n--) {
        bool lifted = cover[n] == 0 and lift(n, -1);
        if (cover[n] == -1 or lifted) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }
    }

    /**
     * The main loop
     */

    while (!todo.empty()) {
        int n = todo_pop();
        if (cover[n] == -1 or cover[n] == 0) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (cover[from] == 0 and lift(from, n)) todo_push(from);
            }
        }

        while (todo.empty() and coverdepth != 0) {
            int m = coverdepth--;
            std::queue<int> q;

            for (int n=0; n<nodecount(); n++) {
                if (cover[n] != m) continue;
                cover[n] = 0;

                if (trace) logger << "\033[7;31;1muncovering\033[m " << n << std::endl;

                // try to see if it is attracted
                const int pl = owner(n);
                bool escapes = false;
                for (auto curedge = outs(n); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (cover[to] == -2) continue;
                    if (game.isSolved(to)) {
                        if (game.getWinner(to) == pl) {
                            Solver::solve(n, pl, to);
                            cover[n] = -1;
                            pms[k*n+pl] = -1;
                            q.push(n);
                            todo_push(n);
                            break;
                        }
                    } else {
                        escapes = true;
                    }
                }
                if (cover[n] == -1) continue;
                if (!escapes) {
                    Solver::solve(n, 1-pl, -1);
                    cover[n] = -1;
                    pms[k*n+(1-pl)] = -1;
                    q.push(n);
                    todo_push(n);
                    continue;
                }

                // not attracted, lift
                lift(n, -1);

                // TODO: always or only if lifted?
                todo_push(n);
            }

            // attract within uncovered area to <node> for <pl>
            while (!q.empty()) {
                int n = q.front();
                q.pop();
                if (!game.isSolved(n)) LOGIC_ERROR;
                const bool pl = game.getWinner(n);
                for (auto curedge = ins(n); *curedge != -1; curedge++) {
                    int from = *curedge;
                    if (cover[from]) continue;
                    if (owner(from) != pl) {
                        bool escapes = false;
                        for (auto curedge = outs(from); *curedge != -1; curedge++) {
                            int to = *curedge;
                            if (cover[to] < 0) continue;
                            if (cover[to] != 0) LOGIC_ERROR;
                            escapes = true;
                            break;
                        }
                        if (escapes) continue;
                    }
                    Solver::solve(from, pl, owner(from) == pl ? n : -1);
                    // counts[priority(node)]--;
                    cover[from] = -1;
                    pms[k*from+pl] = -1;
                    q.push(from);
                    todo_push(from);
                }
            }
        }
    }

    if (trace) {
        for (int n=0; n<nodecount(); n++) {
            logger << "\033[1;31mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            if (cover[n] >= 0) logger << " cover: " << cover[n];
            logger << std::endl;
        }
    }

    // Now set dominions and derive strategy for even.
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        int *pm = pms + k*i;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(i, winner, owner(i) == winner ? strategy[i] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] cover;
    delete[] dirty;
    delete[] tmp;
    delete[] best;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}